

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_pre_check_results.cc
# Opt level: O0

void anon_unknown.dwarf_152aa7::Json2Type
               (Value *value,RdsDescribePreCheckResultsPreCheckResultType *item)

{
  bool bVar1;
  Value *pVVar2;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  RdsDescribePreCheckResultsPreCheckResultType *local_18;
  RdsDescribePreCheckResultsPreCheckResultType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (RdsDescribePreCheckResultsPreCheckResultType *)value;
  bVar1 = Json::Value::isMember(value,"PreCheckName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"PreCheckName");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)local_18,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"PreCheckResult");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"PreCheckResult");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->pre_check_result,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"FailReasion");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"FailReasion");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->fail_reasion,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"RepairMethod");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"RepairMethod");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->repair_method,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, RdsDescribePreCheckResultsPreCheckResultType* item) {
  if(value.isMember("PreCheckName")) {
    item->pre_check_name = value["PreCheckName"].asString();
  }
  if(value.isMember("PreCheckResult")) {
    item->pre_check_result = value["PreCheckResult"].asString();
  }
  if(value.isMember("FailReasion")) {
    item->fail_reasion = value["FailReasion"].asString();
  }
  if(value.isMember("RepairMethod")) {
    item->repair_method = value["RepairMethod"].asString();
  }
}